

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandMeshMSFT *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *pXVar6;
  XrHandMeshMSFT *in_stack_fffffffffffff9d8;
  allocator local_619;
  string indexbuffer_prefix;
  string vertexbuffer_prefix;
  string type_prefix;
  string vertexbufferchanged_prefix;
  string indexbufferchanged_prefix;
  string isactive_prefix;
  string next_prefix;
  undefined1 local_538 [32];
  string local_518;
  undefined1 local_4f8 [32];
  string local_4d8;
  string local_4b8;
  ostringstream oss_isActive;
  ostringstream oss_vertexBufferChanged;
  ostringstream oss_indexBufferChanged;
  
  PointerToHexString<XrHandMeshMSFT>(in_stack_fffffffffffff9d8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_isActive);
  std::__cxx11::string::~string((string *)&oss_isActive);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_isActive,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_isActive);
    std::__cxx11::string::~string((string *)&oss_isActive);
  }
  else {
    _oss_isActive = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_isActive);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_isActive);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_4b8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  std::__cxx11::string::~string((string *)&local_4b8);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&isactive_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&isactive_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_isActive);
  poVar4 = std::operator<<((ostream *)&oss_isActive,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"XrBool32",&isactive_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_indexBufferChanged);
  std::__cxx11::string::~string((string *)&oss_indexBufferChanged);
  std::__cxx11::string::string((string *)&indexbufferchanged_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&indexbufferchanged_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexBufferChanged);
  poVar4 = std::operator<<((ostream *)&oss_indexBufferChanged,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"XrBool32",&indexbufferchanged_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_vertexBufferChanged);
  std::__cxx11::string::~string((string *)&oss_vertexBufferChanged);
  std::__cxx11::string::string((string *)&vertexbufferchanged_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&vertexbufferchanged_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexBufferChanged);
  poVar4 = std::operator<<((ostream *)&oss_vertexBufferChanged,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"XrBool32",&vertexbufferchanged_prefix,&indexbuffer_prefix);
  std::__cxx11::string::~string((string *)&indexbuffer_prefix);
  std::__cxx11::string::string((string *)&indexbuffer_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&indexbuffer_prefix);
  std::__cxx11::string::string((string *)(local_4f8 + 0x20),(string *)&indexbuffer_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_4f8;
  std::__cxx11::string::string
            ((string *)pXVar6,"XrHandMeshIndexBufferMSFT",(allocator *)&vertexbuffer_prefix);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->indexBuffer,(string *)(local_4f8 + 0x20),(string *)local_4f8,
                     false,contents);
  std::__cxx11::string::~string((string *)local_4f8);
  std::__cxx11::string::~string((string *)(local_4f8 + 0x20));
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&vertexbuffer_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&vertexbuffer_prefix);
  std::__cxx11::string::string((string *)(local_538 + 0x20),(string *)&vertexbuffer_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_538;
  std::__cxx11::string::string((string *)pXVar6,"XrHandMeshVertexBufferMSFT",&local_619);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->vertexBuffer,(string *)(local_538 + 0x20),(string *)local_538,
                     false,contents);
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::string::~string((string *)(local_538 + 0x20));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&vertexbuffer_prefix);
    std::__cxx11::string::~string((string *)&indexbuffer_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexBufferChanged);
    std::__cxx11::string::~string((string *)&vertexbufferchanged_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexBufferChanged);
    std::__cxx11::string::~string((string *)&indexbufferchanged_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_isActive);
    std::__cxx11::string::~string((string *)&isactive_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandMeshMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string isactive_prefix = prefix;
        isactive_prefix += "isActive";
        std::ostringstream oss_isActive;
        oss_isActive << "0x" << std::hex << (value->isActive);
        contents.emplace_back("XrBool32", isactive_prefix, oss_isActive.str());
        std::string indexbufferchanged_prefix = prefix;
        indexbufferchanged_prefix += "indexBufferChanged";
        std::ostringstream oss_indexBufferChanged;
        oss_indexBufferChanged << "0x" << std::hex << (value->indexBufferChanged);
        contents.emplace_back("XrBool32", indexbufferchanged_prefix, oss_indexBufferChanged.str());
        std::string vertexbufferchanged_prefix = prefix;
        vertexbufferchanged_prefix += "vertexBufferChanged";
        std::ostringstream oss_vertexBufferChanged;
        oss_vertexBufferChanged << "0x" << std::hex << (value->vertexBufferChanged);
        contents.emplace_back("XrBool32", vertexbufferchanged_prefix, oss_vertexBufferChanged.str());
        std::string indexbuffer_prefix = prefix;
        indexbuffer_prefix += "indexBuffer";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->indexBuffer, indexbuffer_prefix, "XrHandMeshIndexBufferMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexbuffer_prefix = prefix;
        vertexbuffer_prefix += "vertexBuffer";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->vertexBuffer, vertexbuffer_prefix, "XrHandMeshVertexBufferMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}